

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Equalizer.cpp
# Opt level: O3

int Equalizer::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  UnityAudioParameterDefinition *pUVar1;
  
  pUVar1 = (UnityAudioParameterDefinition *)operator_new__(0x340);
  definition->paramdefs = pUVar1;
  RegisterParameter(definition,"MasterGain","dB",-100.0,100.0,0.0,1.0,1.0,0,"Overall gain applied");
  RegisterParameter(definition,"LowGain","dB",-100.0,100.0,0.0,1.0,1.0,1,
                    "Gain applied to lower frequency band");
  RegisterParameter(definition,"MidGain","dB",-100.0,100.0,0.0,1.0,1.0,2,
                    "Gain applied to middle frequency band");
  RegisterParameter(definition,"HighGain","dB",-100.0,100.0,0.0,1.0,1.0,3,
                    "Gain applied to high frequency band");
  RegisterParameter(definition,"LowFreq","Hz",0.01,24000.0,800.0,1.0,3.0,4,
                    "Cutoff frequency of lower frequency band");
  RegisterParameter(definition,"MidFreq","Hz",0.01,24000.0,4000.0,1.0,3.0,5,
                    "Center frequency of middle frequency band");
  RegisterParameter(definition,"HighFreq","Hz",0.01,24000.0,8000.0,1.0,3.0,6,
                    "Cutoff frequency of high frequency band");
  RegisterParameter(definition,"LowQ","",0.01,10.0,0.707,1.0,3.0,7,
                    "Q-factor of lower frequency band (inversely proportional to resonance)");
  RegisterParameter(definition,"MidQ","",0.01,10.0,0.707,1.0,3.0,8,
                    "Q-factor of middle frequency band (inversely proportional to resonance)");
  RegisterParameter(definition,"HighQ","",0.01,10.0,0.707,1.0,3.0,9,
                    "Q-factor of high frequency band (inversely proportional to resonance)");
  RegisterParameter(definition,"UseLogScale","",0.0,1.0,1.0,1.0,1.0,10,
                    "Use logarithmic scale for plotting the filter curve frequency response and input/output spectra"
                   );
  RegisterParameter(definition,"ShowSpectrum","",0.0,1.0,0.0,1.0,1.0,0xb,
                    "Overlay input spectrum (green) and output spectrum (red)");
  RegisterParameter(definition,"SpectrumDecay","dB/s",-50.0,0.0,-10.0,1.0,1.0,0xc,
                    "Hold time for overlaid spectra");
  return 0xd;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "MasterGain", "dB", -100.0f, 100.0f, 0.0f, 1.0f, 1.0f, P_MasterGain, "Overall gain applied");
        RegisterParameter(definition, "LowGain", "dB", -100.0f, 100.0f, 0.0f, 1.0f, 1.0f, P_LowGain, "Gain applied to lower frequency band");
        RegisterParameter(definition, "MidGain", "dB", -100.0f, 100.0f, 0.0f, 1.0f, 1.0f, P_MidGain, "Gain applied to middle frequency band");
        RegisterParameter(definition, "HighGain", "dB", -100.0f, 100.0f, 0.0f, 1.0f, 1.0f, P_HighGain, "Gain applied to high frequency band");
        RegisterParameter(definition, "LowFreq", "Hz", 0.01f, 24000.0f, 800.0f, 1.0f, 3.0f, P_LowFreq, "Cutoff frequency of lower frequency band");
        RegisterParameter(definition, "MidFreq", "Hz", 0.01f, 24000.0f, 4000.0f, 1.0f, 3.0f, P_MidFreq, "Center frequency of middle frequency band");
        RegisterParameter(definition, "HighFreq", "Hz", 0.01f, 24000.0f, 8000.0f, 1.0f, 3.0f, P_HighFreq, "Cutoff frequency of high frequency band");
        RegisterParameter(definition, "LowQ", "", 0.01f, 10.0f, 0.707f, 1.0f, 3.0f, P_LowQ, "Q-factor of lower frequency band (inversely proportional to resonance)");
        RegisterParameter(definition, "MidQ", "", 0.01f, 10.0f, 0.707f, 1.0f, 3.0f, P_MidQ, "Q-factor of middle frequency band (inversely proportional to resonance)");
        RegisterParameter(definition, "HighQ", "", 0.01f, 10.0f, 0.707f, 1.0f, 3.0f, P_HighQ, "Q-factor of high frequency band (inversely proportional to resonance)");
        RegisterParameter(definition, "UseLogScale", "", 0.0f, 1.0f, 1.0f, 1.0f, 1.0f, P_UseLogScale, "Use logarithmic scale for plotting the filter curve frequency response and input/output spectra");
        RegisterParameter(definition, "ShowSpectrum", "", 0.0f, 1.0f, 0.0f, 1.0f, 1.0f, P_ShowSpectrum, "Overlay input spectrum (green) and output spectrum (red)");
        RegisterParameter(definition, "SpectrumDecay", "dB/s", -50.0f, 0.0f, -10.0f, 1.0f, 1.0f, P_SpectrumDecay, "Hold time for overlaid spectra");
        return numparams;
    }